

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec3 *coord,Vec2 *fBounds,Vec4 *result)

{
  bool bVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int dim_03;
  int dim_04;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  deInt32 dVar10;
  deInt32 dVar11;
  deInt32 dVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 local_f0 [8];
  Vec4 c1;
  Vec4 c0;
  int i1;
  int j1;
  int k1;
  int i0;
  int j0;
  int k0;
  int maxK1;
  int minK1;
  int maxK0;
  int minK0;
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 wBounds1;
  Vec2 wBounds0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int d1;
  int d0;
  int h1;
  int h0;
  int w1;
  int w0;
  Vec2 *fBounds_local;
  Vec3 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  dim_01 = ConstPixelBufferAccess::getHeight(level0);
  dim_02 = ConstPixelBufferAccess::getHeight(level1);
  dim_03 = ConstPixelBufferAccess::getDepth(level0);
  dim_04 = ConstPixelBufferAccess::getDepth(level1);
  bVar1 = sampler->normalizedCoords;
  fVar14 = Vector<float,_3>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,fVar14,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar14 = Vector<float,_3>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar1 & 1),dim_00,fVar14,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar14 = Vector<float,_3>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar1 & 1),dim_01,fVar14,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar14 = Vector<float,_3>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&wBounds0,(bool)(bVar1 & 1),dim_02,fVar14,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar14 = Vector<float,_3>::z(coord);
  iVar2 = Vector<int,_3>::z(&prec->coordBits);
  iVar3 = Vector<int,_3>::z(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&wBounds1,(bool)(bVar1 & 1),dim_03,fVar14,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar14 = Vector<float,_3>::z(coord);
  iVar2 = Vector<int,_3>::z(&prec->coordBits);
  iVar3 = Vector<int,_3>::z(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_04,fVar14,iVar2,iVar3);
  fVar14 = Vector<float,_2>::x(&uBounds1);
  dVar4 = deFloorFloatToInt32(fVar14);
  fVar14 = Vector<float,_2>::y(&uBounds1);
  dVar5 = deFloorFloatToInt32(fVar14);
  fVar14 = Vector<float,_2>::x(&vBounds0);
  fVar14 = (float)deFloorFloatToInt32(fVar14);
  fVar15 = Vector<float,_2>::y(&vBounds0);
  dVar6 = deFloorFloatToInt32(fVar15);
  fVar15 = Vector<float,_2>::x(&vBounds1);
  dVar7 = deFloorFloatToInt32(fVar15);
  fVar15 = Vector<float,_2>::y(&vBounds1);
  dVar8 = deFloorFloatToInt32(fVar15);
  fVar15 = Vector<float,_2>::x(&wBounds0);
  fVar15 = (float)deFloorFloatToInt32(fVar15);
  fVar16 = Vector<float,_2>::y(&wBounds0);
  dVar9 = deFloorFloatToInt32(fVar16);
  fVar16 = Vector<float,_2>::x(&wBounds1);
  i0 = deFloorFloatToInt32(fVar16);
  fVar16 = Vector<float,_2>::y(&wBounds1);
  dVar10 = deFloorFloatToInt32(fVar16);
  fVar16 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  dVar11 = deFloorFloatToInt32(fVar16);
  fVar16 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar12 = deFloorFloatToInt32(fVar16);
  do {
    k1 = dVar7;
    if (dVar10 < i0) {
      return false;
    }
    for (; j1 = dVar4, k1 <= dVar8; k1 = k1 + 1) {
      for (; i1 = dVar11, j1 <= dVar5; j1 = j1 + 1) {
        for (; c0.m_data[3] = fVar15, i1 <= dVar12; i1 = i1 + 1) {
          for (; c0.m_data[2] = fVar14, (int)c0.m_data[3] <= dVar9;
              c0.m_data[3] = (float)((int)c0.m_data[3] + 1)) {
            for (; (int)c0.m_data[2] <= dVar6; c0.m_data[2] = (float)((int)c0.m_data[2] + 1)) {
              iVar2 = TexVerifierUtil::wrap(sampler->wrapS,j1,dim);
              iVar3 = TexVerifierUtil::wrap(sampler->wrapT,k1,dim_01);
              iVar13 = TexVerifierUtil::wrap(sampler->wrapR,i0,dim_03);
              lookup<float>((tcu *)(c1.m_data + 2),level0,sampler,iVar2,iVar3,iVar13);
              iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)c0.m_data[2],dim_00);
              iVar3 = TexVerifierUtil::wrap(sampler->wrapT,(int)c0.m_data[3],dim_02);
              iVar13 = TexVerifierUtil::wrap(sampler->wrapR,i1,dim_04);
              lookup<float>((tcu *)local_f0,level1,sampler,iVar2,iVar3,iVar13);
              bVar1 = isLinearRangeValid(prec,(Vec4 *)(c1.m_data + 2),(Vec4 *)local_f0,fBounds,
                                         result);
              if (bVar1) {
                return true;
              }
            }
          }
        }
      }
    }
    i0 = i0 + 1;
  } while( true );
}

Assistant:

static bool isNearestMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const LookupPrecision&			prec,
													const Vec3&						coord,
													const Vec2&						fBounds,
													const Vec4&						result)
{
	const int		w0				= level0.getWidth();
	const int		w1				= level1.getWidth();
	const int		h0				= level0.getHeight();
	const int		h1				= level1.getHeight();
	const int		d0				= level0.getDepth();
	const int		d1				= level1.getDepth();

	const Vec2		uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2		vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2		wBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, d0,	coord.z(), prec.coordBits.z(), prec.uvwBits.z());
	const Vec2		wBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, d1,	coord.z(), prec.coordBits.z(), prec.uvwBits.z());

	// Integer coordinates - without wrap mode
	const int		minI0			= deFloorFloatToInt32(uBounds0.x());
	const int		maxI0			= deFloorFloatToInt32(uBounds0.y());
	const int		minI1			= deFloorFloatToInt32(uBounds1.x());
	const int		maxI1			= deFloorFloatToInt32(uBounds1.y());
	const int		minJ0			= deFloorFloatToInt32(vBounds0.x());
	const int		maxJ0			= deFloorFloatToInt32(vBounds0.y());
	const int		minJ1			= deFloorFloatToInt32(vBounds1.x());
	const int		maxJ1			= deFloorFloatToInt32(vBounds1.y());
	const int		minK0			= deFloorFloatToInt32(wBounds0.x());
	const int		maxK0			= deFloorFloatToInt32(wBounds0.y());
	const int		minK1			= deFloorFloatToInt32(wBounds1.x());
	const int		maxK1			= deFloorFloatToInt32(wBounds1.y());

	for (int k0 = minK0; k0 <= maxK0; k0++)
	{
		for (int j0 = minJ0; j0 <= maxJ0; j0++)
		{
			for (int i0 = minI0; i0 <= maxI0; i0++)
			{
				for (int k1 = minK1; k1 <= maxK1; k1++)
				{
					for (int j1 = minJ1; j1 <= maxJ1; j1++)
					{
						for (int i1 = minI1; i1 <= maxI1; i1++)
						{
							const Vec4	c0	= lookup<float>(level0, sampler, wrap(sampler.wrapS, i0, w0), wrap(sampler.wrapT, j0, h0), wrap(sampler.wrapR, k0, d0));
							const Vec4	c1	= lookup<float>(level1, sampler, wrap(sampler.wrapS, i1, w1), wrap(sampler.wrapT, j1, h1), wrap(sampler.wrapR, k1, d1));

							if (isLinearRangeValid(prec, c0, c1, fBounds, result))
								return true;
						}
					}
				}
			}
		}
	}

	return false;
}